

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void transaction_test(void)

{
  void *pvVar1;
  void *__s2;
  fdb_doc *pfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_txn2;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn3;
  fdb_kvs_handle *db_txn3;
  fdb_kvs_config kvs_config;
  fdb_doc *apfStack_488 [10];
  char bodybuf [256];
  char keybuf [256];
  timeval __test_begin;
  char metabuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar3 = fdb_set_log_callback(db,logCallbackFunc,"transaction_test");
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xbf3);
    transaction_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xbf3,"void transaction_test()");
  }
  fdb_open(&dbfile_txn1,"mvcc_test1",&fconfig);
  fdb_open(&dbfile_txn2,"mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
  fdb_kvs_open_default(dbfile_txn2,&db_txn2,&kvs_config);
  fdb_begin_transaction(dbfile_txn1,'\x02');
  fdb_begin_transaction(dbfile_txn2,'\x02');
  lVar11 = 0;
  for (uVar8 = 0; uVar8 != 5; uVar8 = uVar8 + 1) {
    sprintf(keybuf,"key%d",uVar8 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar8 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar8 & 0xffffffff);
    sVar5 = strlen(keybuf);
    sVar6 = strlen(metabuf);
    sVar7 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_488 + lVar11),keybuf,sVar5,metabuf,sVar6,bodybuf,
                   sVar7);
    fdb_set(db_txn1,apfStack_488[uVar8]);
    lVar11 = lVar11 + 8;
  }
  lVar11 = 0x28;
  for (uVar8 = 5; uVar8 != 10; uVar8 = uVar8 + 1) {
    sprintf(keybuf,"key%d",uVar8 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar8 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar8 & 0xffffffff);
    sVar5 = strlen(keybuf);
    sVar6 = strlen(metabuf);
    sVar7 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_488 + lVar11),keybuf,sVar5,metabuf,sVar6,bodybuf,
                   sVar7);
    fdb_set(db_txn2,apfStack_488[uVar8]);
    lVar11 = lVar11 + 8;
  }
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db_txn1,rdoc);
    if (uVar9 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc1a);
        transaction_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc1a,"void transaction_test()");
      }
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc1c);
      transaction_test()::__test_pass = 1;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc1c,"void transaction_test()");
    }
    fdb_doc_free(rdoc);
  }
  fdb_open(&dbfile_txn3,"mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile_txn3,&db_txn3,&kvs_config);
  fdb_begin_transaction(dbfile_txn3,'\x03');
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db_txn3,rdoc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc29);
      transaction_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc29,"void transaction_test()");
    }
    fdb_doc_free(rdoc);
  }
  fdb_end_transaction(dbfile_txn3,'\0');
  fdb_close(dbfile_txn3);
  fdb_end_transaction(dbfile_txn1,'\0');
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db,rdoc);
    if (uVar9 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc38);
        transaction_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc38,"void transaction_test()");
      }
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc3a);
      transaction_test()::__test_pass = 1;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc3a,"void transaction_test()");
    }
    fdb_doc_free(rdoc);
  }
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db_txn2,rdoc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc44);
      transaction_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc44,"void transaction_test()");
    }
    fdb_doc_free(rdoc);
  }
  fdb_abort_transaction(dbfile_txn2);
  fdb_close(dbfile);
  fdb_open(&dbfile,"mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar3 = fdb_set_log_callback(db,logCallbackFunc,"transaction_test");
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xc51);
    transaction_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xc51,"void transaction_test()");
  }
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db,rdoc);
    if (uVar9 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc59);
        transaction_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc59,"void transaction_test()");
      }
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc5b);
      transaction_test()::__test_pass = 1;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc5b,"void transaction_test()");
    }
    fdb_doc_free(rdoc);
  }
  for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
    fdb_set(db,apfStack_488[lVar11 + 5]);
  }
  fdb_commit(dbfile,'\0');
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db,rdoc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc6b);
      transaction_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc6b,"void transaction_test()");
    }
    fdb_doc_free(rdoc);
  }
  fdb_begin_transaction(dbfile_txn1,'\x02');
  fdb_begin_transaction(dbfile_txn2,'\x02');
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar9);
    sprintf(metabuf,"meta%d",(ulong)uVar9);
    sprintf(bodybuf,"body%d_txn1",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    sVar6 = strlen(metabuf);
    sVar7 = strlen(bodybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,metabuf,sVar6,bodybuf,sVar7);
    fdb_set(db_txn1,rdoc);
    fdb_doc_free(rdoc);
    sprintf(bodybuf,"body%d_txn2",(ulong)uVar9);
    sVar5 = strlen(keybuf);
    sVar6 = strlen(metabuf);
    sVar7 = strlen(bodybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,metabuf,sVar6,bodybuf,sVar7);
    fdb_set(db_txn2,rdoc);
    fdb_doc_free(rdoc);
  }
  uVar8 = 0;
  while( true ) {
    if (uVar8 == 10) {
      fdb_end_transaction(dbfile_txn2,'\0');
      uVar9 = 0;
      while( true ) {
        if (uVar9 == 10) {
          fdb_end_transaction(dbfile_txn1,'\0');
          for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
            sprintf(keybuf,"key%d",(ulong)uVar9);
            sVar5 = strlen(keybuf);
            fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
            fVar3 = fdb_get(db,rdoc);
            if (fVar3 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xcbd);
              transaction_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xcbd,"void transaction_test()");
            }
            sprintf(bodybuf,"body%d_txn1",(ulong)uVar9);
            pfVar2 = rdoc;
            pvVar1 = rdoc->body;
            iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
            if (iVar4 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xcbf);
              transaction_test()::__test_pass = 1;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xcbf,"void transaction_test()");
            }
            fdb_doc_free(pfVar2);
          }
          fdb_begin_transaction(dbfile_txn1,'\x02');
          sprintf(keybuf,"key%d",5);
          sprintf(metabuf,"meta%d",5);
          sprintf(bodybuf,"body%d_before_compaction",5);
          sVar5 = strlen(keybuf);
          sVar6 = strlen(metabuf);
          sVar7 = strlen(bodybuf);
          fdb_doc_create(&rdoc,keybuf,sVar5,metabuf,sVar6,bodybuf,sVar7);
          fdb_set(db_txn1,rdoc);
          fdb_doc_free(rdoc);
          fdb_compact(dbfile,"mvcc_test2");
          sVar5 = strlen(keybuf);
          fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
          fVar3 = fdb_get(db_txn1,rdoc);
          pfVar2 = rdoc;
          if (fVar3 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xcd7);
            transaction_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xcd7,"void transaction_test()");
          }
          pvVar1 = rdoc->body;
          iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
          if (iVar4 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xcd8);
            transaction_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xcd8,"void transaction_test()");
          }
          fdb_doc_free(pfVar2);
          sVar5 = strlen(keybuf);
          fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
          fVar3 = fdb_get(db,rdoc);
          if (fVar3 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xcde);
            transaction_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xcde,"void transaction_test()");
          }
          sprintf(bodybuf,"body%d_txn1",5);
          pfVar2 = rdoc;
          pvVar1 = rdoc->body;
          iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
          if (iVar4 == 0) {
            fdb_doc_free(pfVar2);
            fdb_end_transaction(dbfile_txn1,'\0');
            uVar9 = 0;
            while( true ) {
              if (uVar9 == 10) {
                fdb_close(dbfile);
                fdb_open(&dbfile,"mvcc_test2",&fconfig);
                fdb_kvs_open_default(dbfile,&db,&kvs_config);
                fVar3 = fdb_set_log_callback(db,logCallbackFunc,"transaction_test");
                if (fVar3 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xcfb);
                  transaction_test()::__test_pass = 1;
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                ,0xcfb,"void transaction_test()");
                }
                uVar9 = 0;
                while( true ) {
                  if (uVar9 == 10) {
                    fdb_close(dbfile);
                    fdb_close(dbfile_txn1);
                    fdb_close(dbfile_txn2);
                    for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
                      fdb_doc_free(apfStack_488[lVar11]);
                    }
                    fdb_shutdown();
                    memleak_end();
                    pcVar10 = "%s PASSED\n";
                    if (transaction_test()::__test_pass != '\0') {
                      pcVar10 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar10,"transaction test");
                    return;
                  }
                  sprintf(keybuf,"key%d",(ulong)uVar9);
                  sVar5 = strlen(keybuf);
                  fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
                  fVar3 = fdb_get(db,rdoc);
                  if (fVar3 != FDB_RESULT_SUCCESS) break;
                  if (uVar9 == 5) {
                    pcVar10 = "body%d_before_compaction";
                    uVar8 = 5;
                  }
                  else {
                    pcVar10 = "body%d_txn1";
                    uVar8 = (ulong)uVar9;
                  }
                  sprintf(bodybuf,pcVar10,uVar8);
                  pfVar2 = rdoc;
                  pvVar1 = rdoc->body;
                  iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
                  if (iVar4 != 0) {
                    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xd08);
                    transaction_test()::__test_pass = 1;
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                  ,0xd08,"void transaction_test()");
                  }
                  fdb_doc_free(pfVar2);
                  uVar9 = uVar9 + 1;
                }
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xd02);
                transaction_test()::__test_pass = 1;
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0xd02,"void transaction_test()");
              }
              sprintf(keybuf,"key%d",(ulong)uVar9);
              sVar5 = strlen(keybuf);
              fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
              fVar3 = fdb_get(db,rdoc);
              if (fVar3 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xceb);
                transaction_test()::__test_pass = 1;
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0xceb,"void transaction_test()");
              }
              if (uVar9 == 5) {
                pcVar10 = "body%d_before_compaction";
                uVar8 = 5;
              }
              else {
                pcVar10 = "body%d_txn1";
                uVar8 = (ulong)uVar9;
              }
              sprintf(bodybuf,pcVar10,uVar8);
              pfVar2 = rdoc;
              pvVar1 = rdoc->body;
              iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
              if (iVar4 != 0) break;
              fdb_doc_free(pfVar2);
              uVar9 = uVar9 + 1;
            }
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xcf1);
            transaction_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xcf1,"void transaction_test()");
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xce0);
          transaction_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xce0,"void transaction_test()");
        }
        sprintf(keybuf,"key%d",(ulong)uVar9);
        sVar5 = strlen(keybuf);
        fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
        fVar3 = fdb_get(db,rdoc);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xca8);
          transaction_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xca8,"void transaction_test()");
        }
        sprintf(bodybuf,"body%d_txn2",(ulong)uVar9);
        pfVar2 = rdoc;
        pvVar1 = rdoc->body;
        iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xcaa);
          transaction_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xcaa,"void transaction_test()");
        }
        fdb_doc_free(pfVar2);
        sVar5 = strlen(keybuf);
        fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
        fVar3 = fdb_get(db_txn1,rdoc);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xcb0);
          transaction_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xcb0,"void transaction_test()");
        }
        sprintf(bodybuf,"body%d_txn1",(ulong)uVar9);
        pfVar2 = rdoc;
        pvVar1 = rdoc->body;
        iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
        if (iVar4 != 0) break;
        fdb_doc_free(pfVar2);
        uVar9 = uVar9 + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xcb2);
      transaction_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xcb2,"void transaction_test()");
    }
    sprintf(keybuf,"key%d",uVar8 & 0xffffffff);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db,rdoc);
    pfVar2 = rdoc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc8c);
      transaction_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc8c,"void transaction_test()");
    }
    pvVar1 = rdoc->body;
    __s2 = apfStack_488[uVar8]->body;
    iVar4 = bcmp(pvVar1,__s2,rdoc->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",__s2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc8d);
      transaction_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc8d,"void transaction_test()");
    }
    fdb_doc_free(pfVar2);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db_txn1,rdoc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc93);
      transaction_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc93,"void transaction_test()");
    }
    sprintf(bodybuf,"body%d_txn1",uVar8 & 0xffffffff);
    pfVar2 = rdoc;
    pvVar1 = rdoc->body;
    iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
    if (iVar4 != 0) break;
    fdb_doc_free(pfVar2);
    sVar5 = strlen(keybuf);
    fdb_doc_create(&rdoc,keybuf,sVar5,(void *)0x0,0,(void *)0x0,0);
    fVar3 = fdb_get(db_txn2,rdoc);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc9b);
      transaction_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc9b,"void transaction_test()");
    }
    sprintf(bodybuf,"body%d_txn2",uVar8 & 0xffffffff);
    pfVar2 = rdoc;
    pvVar1 = rdoc->body;
    iVar4 = bcmp(pvVar1,bodybuf,rdoc->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc9d);
      transaction_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc9d,"void transaction_test()");
    }
    fdb_doc_free(pfVar2);
    uVar8 = uVar8 + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xc95);
  transaction_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc95,"void transaction_test()");
}

Assistant:

void transaction_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2, *dbfile_txn3;
    fdb_kvs_handle *db, *db_txn1, *db_txn2, *db_txn3;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open db and begin transactions
    fdb_open(&dbfile_txn1, "mvcc_test1", &fconfig);
    fdb_open(&dbfile_txn2, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // insert half docs into txn1
    for (i=0;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, doc[i]);
    }

    // insert other half docs into txn2
    for (i=n/2;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, doc[i]);
    }

    // uncommitted docs should not be read by the other transaction that
    // doesn't allow uncommitted reads.
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // uncommitted docs can be read by the transaction that allows uncommitted reads.
    fdb_open(&dbfile_txn3, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn3, &db_txn3, &kvs_config);
    fdb_begin_transaction(dbfile_txn3, FDB_ISOLATION_READ_UNCOMMITTED);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn3, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    fdb_end_transaction(dbfile_txn3, FDB_COMMIT_NORMAL);
    fdb_close(dbfile_txn3);

    // commit and end txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);

    // uncommitted docs should not be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // read uncommitted docs using the same transaction
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // abort txn2
    fdb_abort_transaction(dbfile_txn2);

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // uncommitted docs should not be read after reopening the file either
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // insert other half docs & commit
    for (i=n/2;i<n;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now all docs can be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // begin transactions
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, rdoc);
        fdb_doc_free(rdoc);

        sprintf(bodybuf, "body%d_txn2", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, rdoc);
        fdb_doc_free(rdoc);
    }

    // retrieve check
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn2 & retrieve check
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn1 & retrieve check
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // begin new transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    // update doc#5
    i = 5;
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "body%d_before_compaction", i);
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                            (void*)metabuf, strlen(metabuf),
                            (void*)bodybuf, strlen(bodybuf));
    fdb_set(db_txn1, rdoc);
    fdb_doc_free(rdoc);

    // do compaction
    fdb_compact(dbfile, "mvcc_test2");

    // retrieve doc#5
    // using txn1
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db_txn1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // general retrieval
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    sprintf(bodybuf, "body%d_txn1", i);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // commit transaction
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    // retrieve check
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test2", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve check again
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction test");
}